

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::set_data
          (section_impl<ELFIO::Elf32_Shdr> *this,char *raw_data,Elf_Word size)

{
  int iVar1;
  void *pvVar2;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  bad_alloc *anon_var_0;
  char *__result;
  char *in_stack_ffffffffffffffd0;
  
  iVar1 = (**(code **)(*in_RDI + 0x28))();
  if (iVar1 != 8) {
    __result = (char *)in_RDI[0xc];
    if (__result != (char *)0x0) {
      operator_delete__(__result);
    }
    pvVar2 = operator_new__((ulong)in_EDX);
    in_RDI[0xc] = (long)pvVar2;
    if ((in_RDI[0xc] != 0) && (in_RSI != 0)) {
      *(uint *)(in_RDI + 0xd) = in_EDX;
      std::copy<char_const*,char*>(in_stack_ffffffffffffffd0,(char *)in_RDI,__result);
    }
  }
  (**(code **)(*in_RDI + 0xa0))(in_RDI,in_EDX);
  return;
}

Assistant:

void
    set_data( const char* raw_data, Elf_Word size )
    {
        if ( get_type() != SHT_NOBITS ) {
            delete [] data;
            try {
                data = new char[size];
            } catch (const std::bad_alloc&) {
                data      = 0;
                data_size = 0;
                size      = 0;
            }
            if ( 0 != data && 0 != raw_data ) {
                data_size = size;
                std::copy( raw_data, raw_data + size, data );
            }
        }

        set_size( size );
    }